

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::Mine::AddScalarDetectionCoefficientValue(Mine *this,KUINT8 SDC)

{
  KUINT8 SDC_local;
  
  MinefieldDataFilter::SetScalarDetectionCoefficient(&this->super_MinefieldDataFilter,true);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->m_vui8SDC,&SDC_local)
  ;
  return;
}

Assistant:

void Mine::AddScalarDetectionCoefficientValue( KUINT8 SDC )
{
    SetScalarDetectionCoefficient( true );
    m_vui8SDC.push_back( SDC );
}